

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall cmComputeLinkInformation::AddImplicitLinkInfo(cmComputeLinkInformation *this)

{
  pointer pbVar1;
  bool bVar2;
  LinkClosure *pLVar3;
  string *li;
  pointer __lhs;
  
  pLVar3 = cmGeneratorTarget::GetLinkClosure(this->Target,&this->Config);
  __lhs = (pLVar3->Languages).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (pLVar3->Languages).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (__lhs == pbVar1) {
      return;
    }
    bVar2 = std::operator==(__lhs,"CUDA");
    if (bVar2) {
LAB_00383667:
      AddRuntimeLinkLibrary(this,__lhs);
    }
    else {
      bVar2 = std::operator==(__lhs,"HIP");
      if (bVar2) goto LAB_00383667;
    }
    bVar2 = std::operator!=(__lhs,&this->LinkLanguage);
    if (bVar2) {
      AddImplicitLinkInfo(this,__lhs);
    }
    __lhs = __lhs + 1;
  } while( true );
}

Assistant:

void cmComputeLinkInformation::AddImplicitLinkInfo()
{
  // The link closure lists all languages whose implicit info is needed.
  cmGeneratorTarget::LinkClosure const* lc =
    this->Target->GetLinkClosure(this->Config);
  for (std::string const& li : lc->Languages) {

    if (li == "CUDA" || li == "HIP") {
      // These need to go before the other implicit link information
      // as they could require symbols from those other library
      // Currently restricted as CUDA and HIP are the only languages
      // we have documented runtime behavior controls for
      this->AddRuntimeLinkLibrary(li);
    }

    // Skip those of the linker language.  They are implicit.
    if (li != this->LinkLanguage) {
      this->AddImplicitLinkInfo(li);
    }
  }
}